

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

void __thiscall
argparse::ArgumentParser::parse_args_internal
          (ArgumentParser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *aArguments)

{
  initializer_list<char> __l;
  undefined8 uVar1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  start;
  iterator end_00;
  bool bVar2;
  const_reference __str;
  const_iterator __x;
  reference __lhs;
  size_type sVar3;
  const_reference pvVar4;
  pointer ppVar5;
  pointer pAVar6;
  runtime_error *prVar7;
  string local_188;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_168;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_158;
  _List_iterator<argparse::Argument> local_150;
  _List_iterator<argparse::Argument> tArgument_2;
  _Self local_140;
  iterator tIterator2;
  undefined1 local_120 [8];
  string tHypotheticalArgument;
  size_t j;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tCompoundArgument;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  _List_iterator<argparse::Argument> local_b0;
  _List_iterator<argparse::Argument> tArgument_1;
  _Self local_a0;
  iterator tIterator;
  _List_iterator<argparse::Argument> local_60;
  _Self tArgument;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tCurrentArgument;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  it;
  iterator positionalArgumentIt;
  const_iterator end;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *aArguments_local;
  ArgumentParser *this_local;
  
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (&this->mProgramName);
  if ((bVar2) &&
     (bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(aArguments), !bVar2)) {
    __str = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::front(aArguments);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->mProgramName,__str);
  }
  positionalArgumentIt._M_node =
       (_List_node_base *)
       std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(aArguments);
  it._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::begin<std::__cxx11::list<argparse::Argument,std::allocator<argparse::Argument>>>
                 (&this->mPositionalArguments);
  __x = std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (aArguments);
  local_30 = std::
             next<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                       (__x._M_current,1);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      (&local_30,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&positionalArgumentIt);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      return;
    }
    __lhs = __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&local_30);
    bVar2 = std::operator==(__lhs,"-h");
    if ((bVar2) || (bVar2 = std::operator==(__lhs,"--help"), bVar2)) break;
    bVar2 = Argument::is_positional(__lhs);
    if (bVar2) {
      tArgument._M_node =
           (_List_node_base *)
           std::end<std::__cxx11::list<argparse::Argument,std::allocator<argparse::Argument>>>
                     (&this->mPositionalArguments);
      bVar2 = std::operator==((_Self *)&it,&tArgument);
      if (bVar2) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar7,"Maximum number of positional arguments exceeded");
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_60._M_node =
           (_List_node_base *)
           std::_List_iterator<argparse::Argument>::operator++
                     ((_List_iterator<argparse::Argument> *)&it,0);
      pAVar6 = std::_List_iterator<argparse::Argument>::operator->(&local_60);
      end_00 = positionalArgumentIt;
      start._M_current = local_30._M_current;
      std::__cxx11::string::string((string *)&tIterator);
      local_30 = Argument::
                 consume<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                           (pAVar6,start,
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )end_00._M_node,(string *)&tIterator);
      std::__cxx11::string::~string((string *)&tIterator);
    }
    else {
      local_a0._M_node =
           (_Base_ptr)
           std::
           map<std::basic_string_view<char,std::char_traits<char>>,std::_List_iterator<argparse::Argument>,std::less<void>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>>
           ::find<std::__cxx11::string>
                     ((map<std::basic_string_view<char,std::char_traits<char>>,std::_List_iterator<argparse::Argument>,std::less<void>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>>
                       *)&this->mArgumentMap,__lhs);
      tArgument_1._M_node =
           (_List_node_base *)
           std::
           map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
           ::end(&this->mArgumentMap);
      bVar2 = std::operator==(&local_a0,(_Self *)&tArgument_1);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(__lhs);
        if (((sVar3 < 2) ||
            (pvVar4 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                (__lhs,0), *pvVar4 != '-')) ||
           (pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::operator[](__lhs,1), *pvVar4 == '-')) {
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar7,"Unknown argument");
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_30);
        for (tHypotheticalArgument.field_2._8_8_ = 1; uVar1 = tHypotheticalArgument.field_2._8_8_,
            sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::size(__lhs), (ulong)uVar1 < sVar3;
            tHypotheticalArgument.field_2._8_8_ = tHypotheticalArgument.field_2._8_8_ + 1) {
          tIterator2._M_node._6_1_ = 0x2d;
          pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   operator[](__lhs,tHypotheticalArgument.field_2._8_8_);
          tIterator2._M_node._7_1_ = *pvVar4;
          std::allocator<char>::allocator();
          __l._M_len = 2;
          __l._M_array = (iterator)((long)&tIterator2._M_node + 6);
          std::__cxx11::string::string
                    ((string *)local_120,__l,(allocator<char> *)((long)&tIterator2._M_node + 5));
          std::allocator<char>::~allocator((allocator<char> *)((long)&tIterator2._M_node + 5));
          local_140._M_node =
               (_Base_ptr)
               std::
               map<std::basic_string_view<char,std::char_traits<char>>,std::_List_iterator<argparse::Argument>,std::less<void>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>>
               ::find<std::__cxx11::string>
                         ((map<std::basic_string_view<char,std::char_traits<char>>,std::_List_iterator<argparse::Argument>,std::less<void>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>>
                           *)&this->mArgumentMap,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_120);
          tArgument_2._M_node =
               (_List_node_base *)
               std::
               map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
               ::end(&this->mArgumentMap);
          bVar2 = std::operator==(&local_140,(_Self *)&tArgument_2);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar7,"Unknown argument");
            __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          ppVar5 = std::
                   _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>
                   ::operator->(&local_140);
          local_150._M_node = (ppVar5->second)._M_node;
          pAVar6 = std::_List_iterator<argparse::Argument>::operator->(&local_150);
          local_160._M_current = local_30._M_current;
          local_168._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               positionalArgumentIt._M_node;
          std::__cxx11::string::string
                    ((string *)&local_188,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120)
          ;
          local_158 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      Argument::
                      consume<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                                (pAVar6,local_160,local_168,&local_188);
          local_30 = (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )local_158;
          std::__cxx11::string::~string((string *)&local_188);
          std::__cxx11::string::~string((string *)local_120);
        }
      }
      else {
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>
                 ::operator->(&local_a0);
        local_b0._M_node = (ppVar5->second)._M_node;
        pAVar6 = std::_List_iterator<argparse::Argument>::operator->(&local_b0);
        local_c8 = local_30._M_current;
        local_c0 = std::
                   next<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                             (local_30,1);
        local_d0._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             positionalArgumentIt._M_node;
        std::__cxx11::string::string((string *)&tCompoundArgument,__lhs);
        local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   Argument::
                   consume<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                             (pAVar6,local_c0,local_d0,(string *)&tCompoundArgument);
        local_30 = (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )local_b8;
        std::__cxx11::string::~string((string *)&tCompoundArgument);
      }
    }
  }
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar7,"help called");
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void parse_args_internal(const std::vector<std::string> &aArguments) {
    if (mProgramName.empty() && !aArguments.empty()) {
      mProgramName = aArguments.front();
    }
    auto end = std::end(aArguments);
    auto positionalArgumentIt = std::begin(mPositionalArguments);
    for (auto it = std::next(std::begin(aArguments)); it != end;) {
      const auto &tCurrentArgument = *it;
      if (tCurrentArgument == Argument::mHelpOption ||
          tCurrentArgument == Argument::mHelpOptionLong) {
        throw std::runtime_error("help called");
      }
      if (Argument::is_positional(tCurrentArgument)) {
        if (positionalArgumentIt == std::end(mPositionalArguments)) {
          throw std::runtime_error(
              "Maximum number of positional arguments exceeded");
        }
        auto tArgument = positionalArgumentIt++;
        it = tArgument->consume(it, end);
      } else if (auto tIterator = mArgumentMap.find(tCurrentArgument);
                 tIterator != mArgumentMap.end()) {
        auto tArgument = tIterator->second;
        it = tArgument->consume(std::next(it), end, tCurrentArgument);
      } else if (const auto &tCompoundArgument = tCurrentArgument;
                 tCompoundArgument.size() > 1 && tCompoundArgument[0] == '-' &&
                 tCompoundArgument[1] != '-') {
        ++it;
        for (size_t j = 1; j < tCompoundArgument.size(); j++) {
          auto tHypotheticalArgument = std::string{'-', tCompoundArgument[j]};
          auto tIterator2 = mArgumentMap.find(tHypotheticalArgument);
          if (tIterator2 != mArgumentMap.end()) {
            auto tArgument = tIterator2->second;
            it = tArgument->consume(it, end, tHypotheticalArgument);
          } else {
            throw std::runtime_error("Unknown argument");
          }
        }
      } else {
        throw std::runtime_error("Unknown argument");
      }
    }
  }